

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3TokenizerFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  int iVar2;
  uchar *puVar3;
  undefined8 *puVar4;
  char *z;
  char *zErr;
  int n;
  void *pOld;
  int nName;
  uchar *zName;
  void *pPtr;
  Fts3Hash *pHash;
  sqlite3_value **argv_local;
  sqlite3_context *psStack_10;
  int argc_local;
  sqlite3_context *context_local;
  
  zName = (uchar *)0x0;
  pHash = (Fts3Hash *)argv;
  argv_local._4_4_ = argc;
  psStack_10 = context;
  pPtr = sqlite3_user_data(context);
  puVar3 = sqlite3_value_text(*(sqlite3_value **)pHash);
  iVar1 = sqlite3_value_bytes(*(sqlite3_value **)pHash);
  if (argv_local._4_4_ == 2) {
    iVar2 = fts3TokenizerEnabled(psStack_10);
    if ((iVar2 == 0) && (iVar2 = sqlite3_value_frombind((sqlite3_value *)pHash->first), iVar2 == 0))
    {
      sqlite3_result_error(psStack_10,"fts3tokenize disabled",-1);
      return;
    }
    iVar2 = sqlite3_value_bytes((sqlite3_value *)pHash->first);
    if ((puVar3 == (uchar *)0x0) || (iVar2 != 8)) {
      sqlite3_result_error(psStack_10,"argument type mismatch",-1);
      return;
    }
    puVar4 = (undefined8 *)sqlite3_value_blob((sqlite3_value *)pHash->first);
    zName = (uchar *)*puVar4;
    puVar3 = (uchar *)sqlite3Fts3HashInsert((Fts3Hash *)pPtr,puVar3,iVar1 + 1,zName);
    if (puVar3 == zName) {
      sqlite3_result_error(psStack_10,"out of memory",-1);
    }
  }
  else {
    if (puVar3 != (uchar *)0x0) {
      zName = (uchar *)sqlite3Fts3HashFind((Fts3Hash *)pPtr,puVar3,iVar1 + 1);
    }
    if (zName == (uchar *)0x0) {
      z = sqlite3_mprintf("unknown tokenizer: %s",puVar3);
      sqlite3_result_error(psStack_10,z,-1);
      sqlite3_free(z);
      return;
    }
  }
  iVar1 = fts3TokenizerEnabled(psStack_10);
  if ((iVar1 != 0) || (iVar1 = sqlite3_value_frombind(*(sqlite3_value **)pHash), iVar1 != 0)) {
    sqlite3_result_blob(psStack_10,&zName,8,(_func_void_void_ptr *)0xffffffffffffffff);
  }
  return;
}

Assistant:

static void fts3TokenizerFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  Fts3Hash *pHash;
  void *pPtr = 0;
  const unsigned char *zName;
  int nName;

  assert( argc==1 || argc==2 );

  pHash = (Fts3Hash *)sqlite3_user_data(context);

  zName = sqlite3_value_text(argv[0]);
  nName = sqlite3_value_bytes(argv[0])+1;

  if( argc==2 ){
    if( fts3TokenizerEnabled(context) || sqlite3_value_frombind(argv[1]) ){
      void *pOld;
      int n = sqlite3_value_bytes(argv[1]);
      if( zName==0 || n!=sizeof(pPtr) ){
        sqlite3_result_error(context, "argument type mismatch", -1);
        return;
      }
      pPtr = *(void **)sqlite3_value_blob(argv[1]);
      pOld = sqlite3Fts3HashInsert(pHash, (void *)zName, nName, pPtr);
      if( pOld==pPtr ){
        sqlite3_result_error(context, "out of memory", -1);
      }
    }else{
      sqlite3_result_error(context, "fts3tokenize disabled", -1);
      return;
    }
  }else{
    if( zName ){
      pPtr = sqlite3Fts3HashFind(pHash, zName, nName);
    }
    if( !pPtr ){
      char *zErr = sqlite3_mprintf("unknown tokenizer: %s", zName);
      sqlite3_result_error(context, zErr, -1);
      sqlite3_free(zErr);
      return;
    }
  }
  if( fts3TokenizerEnabled(context) || sqlite3_value_frombind(argv[0]) ){
    sqlite3_result_blob(context, (void *)&pPtr, sizeof(pPtr), SQLITE_TRANSIENT);
  }
}